

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O0

void __thiscall
charls::context_run_mode::update_variables
          (context_run_mode *this,int32_t error_value,int32_t e_mapped_error_value,
          uint8_t reset_threshold)

{
  uint8_t reset_threshold_local;
  int32_t e_mapped_error_value_local;
  int32_t error_value_local;
  context_run_mode *this_local;
  
  if (error_value < 0) {
    this->nn_ = this->nn_ + '\x01';
  }
  this->a_ = ((e_mapped_error_value + 1) - this->run_interruption_type_ >> 1) + this->a_;
  if (this->n_ == reset_threshold) {
    this->a_ = this->a_ >> 1;
    this->n_ = (uint8_t)((int)(uint)this->n_ >> 1);
    this->nn_ = (uint8_t)((int)(uint)this->nn_ >> 1);
  }
  this->n_ = this->n_ + '\x01';
  return;
}

Assistant:

void update_variables(const int32_t error_value, const int32_t e_mapped_error_value,
                          const uint8_t reset_threshold) noexcept
    {
        if (error_value < 0)
        {
            ++nn_;
        }

        a_ += (e_mapped_error_value + 1 - run_interruption_type_) >> 1;

        if (n_ == reset_threshold)
        {
            a_ >>= 1;
            n_ = static_cast<uint8_t>(n_ >> 1);
            nn_ = static_cast<uint8_t>(nn_ >> 1);
        }

        ++n_;
    }